

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O3

bool __thiscall HEkk::getBacktrackingBasis(HEkk *this)

{
  bool bVar1;
  int iVar2;
  pointer pdVar3;
  pointer pdVar4;
  HighsInt HVar5;
  HighsInt HVar6;
  uint uVar7;
  ulong uVar8;
  
  bVar1 = (this->info_).valid_backtracking_basis_;
  if (bVar1 == true) {
    std::vector<int,_std::allocator<int>_>::operator=
              (&(this->basis_).basicIndex_,&(this->info_).backtracking_basis_.basicIndex_);
    std::vector<signed_char,_std::allocator<signed_char>_>::operator=
              (&(this->basis_).nonbasicFlag_,&(this->info_).backtracking_basis_.nonbasicFlag_);
    std::vector<signed_char,_std::allocator<signed_char>_>::operator=
              (&(this->basis_).nonbasicMove_,&(this->info_).backtracking_basis_.nonbasicMove_);
    HVar5 = (this->info_).backtracking_basis_.debug_id;
    HVar6 = (this->info_).backtracking_basis_.debug_update_count;
    (this->basis_).hash = (this->info_).backtracking_basis_.hash;
    (this->basis_).debug_id = HVar5;
    (this->basis_).debug_update_count = HVar6;
    std::__cxx11::string::_M_assign((string *)&(this->basis_).debug_origin_name);
    (this->info_).costs_shifted = (this->info_).backtracking_basis_costs_shifted_ != 0;
    (this->info_).costs_perturbed = (this->info_).backtracking_basis_costs_perturbed_ != 0;
    std::vector<double,_std::allocator<double>_>::operator=
              (&(this->info_).workShift_,&(this->info_).backtracking_basis_workShift_);
    iVar2 = (this->lp_).num_row_;
    uVar7 = iVar2 + (this->lp_).num_col_;
    if (uVar7 != 0 && SCARRY4(iVar2,(this->lp_).num_col_) == (int)uVar7 < 0) {
      pdVar3 = (this->info_).backtracking_basis_edge_weight_.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      pdVar4 = (this->scattered_dual_edge_weight_).
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      uVar8 = 0;
      do {
        pdVar4[uVar8] = pdVar3[uVar8];
        uVar8 = uVar8 + 1;
      } while (uVar7 != uVar8);
    }
  }
  return bVar1;
}

Assistant:

bool HEkk::getBacktrackingBasis() {
  if (!info_.valid_backtracking_basis_) return false;
  basis_ = info_.backtracking_basis_;
  info_.costs_shifted = (info_.backtracking_basis_costs_shifted_ != 0);
  info_.costs_perturbed = (info_.backtracking_basis_costs_perturbed_ != 0);
  info_.workShift_ = info_.backtracking_basis_workShift_;
  const HighsInt num_tot = lp_.num_col_ + lp_.num_row_;
  for (HighsInt iVar = 0; iVar < num_tot; iVar++)
    scattered_dual_edge_weight_[iVar] =
        info_.backtracking_basis_edge_weight_[iVar];
  return true;
}